

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O3

UINT8 __thiscall S98Player::LoadTags(S98Player *this)

{
  short *startPtr;
  pointer *pppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  size_type sVar4;
  UINT32 UVar5;
  int iVar6;
  UINT8 *pUVar7;
  mapped_type *this_00;
  _Alloc_hider _Var8;
  _Base_ptr p_Var9;
  iterator iVar10;
  char *pcVar11;
  char **ppcVar12;
  int *startPtr_00;
  string tagData;
  char *tagName;
  string local_88;
  vector<char_const*,std::allocator<char_const*>> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  key_type local_58;
  _Rb_tree_node_base *local_38;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->_tagData)._M_t);
  ppcVar12 = (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  iVar10._M_current =
       (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar10._M_current != ppcVar12) {
    (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar12;
    iVar10._M_current = ppcVar12;
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  if (iVar10._M_current ==
      (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->_tagList,iVar10,
               (char **)&local_88);
  }
  else {
    *iVar10._M_current = (char *)0x0;
    pppcVar1 = &(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  uVar3 = (this->_fileHdr).tagOfs;
  if (uVar3 == 0) {
    return '\0';
  }
  UVar5 = DataLoader_GetSize(this->_dLoad);
  if (UVar5 <= uVar3) {
    return 0xf3;
  }
  startPtr_00 = (int *)(this->_fileData + (this->_fileHdr).tagOfs);
  local_68 = (vector<char_const*,std::allocator<char_const*>> *)&this->_tagList;
  UVar5 = DataLoader_GetSize(this->_dLoad);
  pUVar7 = (UINT8 *)memchr(startPtr_00,0,(ulong)(UVar5 - (this->_fileHdr).tagOfs));
  if (pUVar7 == (UINT8 *)0x0) {
    pUVar7 = this->_fileData;
    UVar5 = DataLoader_GetSize(this->_dLoad);
    pUVar7 = pUVar7 + UVar5;
  }
  if ((this->_fileHdr).fileVer < 3) {
    GetUTF8String_abi_cxx11_(&local_88,this,(char *)startPtr_00,(char *)pUVar7);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"TITLE","");
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->_tagData,&local_58);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_00118133;
  }
  else {
    paVar2 = &local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)paVar2;
    if (((long)pUVar7 - (long)startPtr_00 < 5) ||
       ((char)startPtr_00[1] != ']' || *startPtr_00 != 0x3839535b)) {
      emu_logf(&this->_logger,'\x01',"Invalid S98 tag data!\n");
      emu_logf(&this->_logger,'\x04',"tagData size: %zu, Signature: %.5s\n",
               (long)pUVar7 - (long)startPtr_00,startPtr_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      return 0xf0;
    }
    startPtr = (short *)((long)startPtr_00 + 5);
    if (((long)pUVar7 - (long)startPtr < 3) ||
       (*(char *)((long)startPtr_00 + 7) != -0x41 || *startPtr != -0x4411)) {
      GetUTF8String_abi_cxx11_(&local_58,this,(char *)startPtr,(char *)pUVar7);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      emu_logf(&this->_logger,'\x04',"Note: Tags are UTF-8 encoded.\n");
      std::__cxx11::string::replace
                ((ulong)&local_88,0,(char *)local_88._M_string_length,(ulong)(startPtr_00 + 2));
    }
    ParsePSFTags(this,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == paVar2) goto LAB_00118133;
  }
  operator_delete(local_88._M_dataplus._M_p,
                  CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                           local_88.field_2._M_local_buf[0]) + 1);
LAB_00118133:
  ppcVar12 = (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  iVar10._M_current =
       (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar10._M_current != ppcVar12) {
    (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar12;
    iVar10._M_current = ppcVar12;
  }
  p_Var9 = (this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->_tagData)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var9 != local_38) {
    do {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,*(long *)(p_Var9 + 1),
                 (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
      sVar4 = local_88._M_string_length;
      _Var8._M_p = local_88._M_dataplus._M_p;
      if ((char *)local_88._M_string_length != (char *)0x0) {
        pcVar11 = (char *)0x0;
        do {
          iVar6 = toupper((int)_Var8._M_p[(long)pcVar11]);
          _Var8._M_p[(long)pcVar11] = (char)iVar6;
          pcVar11 = pcVar11 + 1;
        } while ((char *)sVar4 != pcVar11);
      }
      local_58._M_dataplus._M_p = (pointer)0x0;
      ppcVar12 = S98_TAG_MAPPING;
      do {
        ppcVar12 = ppcVar12 + 2;
        iVar6 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar6 == 0) {
          local_58._M_dataplus._M_p = ppcVar12[-1];
          break;
        }
      } while (*ppcVar12 != (char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_88._M_dataplus._M_p;
        iVar10._M_current =
             (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        _Var8._M_p = local_88._M_dataplus._M_p;
        if (iVar10._M_current !=
            (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) goto LAB_00118237;
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  (local_68,iVar10,(char **)&local_60);
      }
      else {
        iVar10._M_current =
             (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        _Var8._M_p = local_58._M_dataplus._M_p;
        if (iVar10._M_current ==
            (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    (local_68,iVar10,(char **)&local_58);
        }
        else {
LAB_00118237:
          *iVar10._M_current = _Var8._M_p;
          pppcVar1 = &(this->_tagList).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      local_60 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(p_Var9 + 2);
      iVar10._M_current =
           (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar10._M_current ==
          (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  (local_68,iVar10,(char **)&local_60);
      }
      else {
        *iVar10._M_current = (char *)local_60;
        pppcVar1 = &(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != local_38);
    iVar10._M_current =
         (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  if (iVar10._M_current ==
      (this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              (local_68,iVar10,(char **)&local_88);
  }
  else {
    *iVar10._M_current = (char *)0x0;
    pppcVar1 = &(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return '\0';
}

Assistant:

UINT8 S98Player::LoadTags(void)
{
	_tagData.clear();
	_tagList.clear();
	_tagList.push_back(NULL);
	if (! _fileHdr.tagOfs)
		return 0x00;
	if (_fileHdr.tagOfs >= DataLoader_GetSize(_dLoad))
		return 0xF3;	// tag error (offset out-of-range)
	
	const char* startPtr;
	const char* endPtr;
	
	// find end of string (can be either '\0' or EOF)
	startPtr = (const char*)&_fileData[_fileHdr.tagOfs];
	endPtr = (const char*)memchr(startPtr, '\0', DataLoader_GetSize(_dLoad) - _fileHdr.tagOfs);
	if (endPtr == NULL)
		endPtr = (const char*)_fileData + DataLoader_GetSize(_dLoad);
	
	if (_fileHdr.fileVer < 3)
	{
		// tag offset = song title (\0-terminated)
		_tagData["TITLE"] = GetUTF8String(startPtr, endPtr);
	}
	else
	{
		std::string tagData;
		bool tagIsUTF8 = false;
		
		// tag offset = PSF tag
		if (endPtr - startPtr < 5 || memcmp(startPtr, "[S98]", 5))
		{
			emu_logf(&_logger, PLRLOG_ERROR, "Invalid S98 tag data!\n");
			emu_logf(&_logger, PLRLOG_DEBUG, "tagData size: %zu, Signature: %.5s\n", endPtr - startPtr, startPtr);
			return 0xF0;
		}
		startPtr += 5;
		if (endPtr - startPtr >= 3)
		{
			if (! memcmp(&startPtr[0], "\xEF\xBB\xBF", 3))	// check for UTF-8 BOM
			{
				tagIsUTF8 = true;
				startPtr += 3;
				emu_logf(&_logger, PLRLOG_DEBUG, "Note: Tags are UTF-8 encoded.\n");
			}
		}
		
		if (tagIsUTF8)
			tagData.assign(startPtr, endPtr);
		else
			tagData = GetUTF8String(startPtr, endPtr);
		ParsePSFTags(tagData);
	}
	
	_tagList.clear();
	
	std::map<std::string, std::string>::const_iterator mapIt;
	for (mapIt = _tagData.begin(); mapIt != _tagData.end(); ++ mapIt)
	{
		std::string curKey = mapIt->first;
		std::transform(curKey.begin(), curKey.end(), curKey.begin(), ::toupper);
		
		const char *tagName = NULL;
		for (const char* const* t = S98_TAG_MAPPING; *t != NULL; t += 2)
		{
			if (curKey == t[0])
			{
				tagName = t[1];
				break;
			}
		}
		
		if (tagName)
			_tagList.push_back(tagName);
		else
			_tagList.push_back(curKey.c_str());
		_tagList.push_back(mapIt->second.c_str());
	}
	
	_tagList.push_back(NULL);
	
	return 0x00;
}